

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O2

int Gia_ManOrderWithBoxes_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  uint uVar2;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 != 0) {
    return 0;
  }
  Gia_ObjSetTravIdCurrent(p,pObj);
  uVar2 = (uint)*(undefined8 *)pObj;
  if ((~uVar2 & 0x9fffffff) == 0) {
    p->iData2 = (uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff;
LAB_0020b6a9:
    iVar1 = 1;
  }
  else {
    if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                    ,0x10c,"int Gia_ManOrderWithBoxes_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    iVar1 = Gia_ObjIsBuf(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjId(p,pObj);
      if ((p->pSibls != (int *)0x0) && (p->pSibls[iVar1] != 0)) {
        iVar1 = Gia_ObjId(p,pObj);
        pObj_00 = Gia_ObjSiblObj(p,iVar1);
        iVar1 = Gia_ManOrderWithBoxes_rec(p,pObj_00,vNodes);
        if (iVar1 != 0) goto LAB_0020b6a9;
      }
      iVar1 = Gia_ManOrderWithBoxes_rec
                        (p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff),vNodes);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = Gia_ManOrderWithBoxes_rec
                        (p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vNodes);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      iVar1 = Gia_ManOrderWithBoxes_rec(p,pObj + -(ulong)(uVar2 & 0x1fffffff),vNodes);
      if (iVar1 != 0) goto LAB_0020b6a9;
    }
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntPush(vNodes,iVar1);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Gia_ManOrderWithBoxes_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        p->iData2 = Gia_ObjCioId(pObj);
        return 1;
    }
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjIsBuf(pObj) )
    {
        if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin0(pObj), vNodes ) )
            return 1;
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        return 0;
    }
    if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
        if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjSiblObj(p, Gia_ObjId(p, pObj)), vNodes ) )
            return 1;
    if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin0(pObj), vNodes ) )
        return 1;
    if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin1(pObj), vNodes ) )
        return 1;
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
    return 0;
}